

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

SnapShot * __thiscall TTD::SnapshotExtractor::CompleteSnapshot(SnapshotExtractor *this)

{
  SnapShot *pSVar1;
  SnapShot *snap;
  SnapshotExtractor *this_local;
  
  pSVar1 = this->m_pendingSnap;
  UnloadDataFromExtractor(this);
  this->m_snapshotsTakenCount = this->m_snapshotsTakenCount + 1;
  this->m_totalMarkMillis = pSVar1->MarkTime + this->m_totalMarkMillis;
  this->m_totalExtractMillis = pSVar1->ExtractTime + this->m_totalExtractMillis;
  if (this->m_maxMarkMillis < pSVar1->MarkTime) {
    this->m_maxMarkMillis = pSVar1->MarkTime;
  }
  if (this->m_maxExtractMillis < pSVar1->ExtractTime) {
    this->m_maxExtractMillis = pSVar1->ExtractTime;
  }
  this->m_lastMarkMillis = pSVar1->MarkTime;
  this->m_lastExtractMillis = pSVar1->ExtractTime;
  return pSVar1;
}

Assistant:

SnapShot* SnapshotExtractor::CompleteSnapshot()
    {
        SnapShot* snap = this->m_pendingSnap;
        this->UnloadDataFromExtractor();

        this->m_snapshotsTakenCount++;
        this->m_totalMarkMillis += snap->MarkTime;
        this->m_totalExtractMillis += snap->ExtractTime;

        if(this->m_maxMarkMillis < snap->MarkTime)
        {
            this->m_maxMarkMillis = snap->MarkTime;
        }

        if(this->m_maxExtractMillis < snap->ExtractTime)
        {
            this->m_maxExtractMillis = snap->ExtractTime;
        }

        this->m_lastMarkMillis = snap->MarkTime;
        this->m_lastExtractMillis = snap->ExtractTime;

        return snap;
    }